

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,IVec4 *coordBits,
              LodPrecision *lodPrec,qpWatchDog *watchDog)

{
  Vec4 *b;
  Vec4 *b_00;
  Vec3 *w;
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int lodOffsNdx;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec3 *s;
  Vec3 *s_00;
  Vec3 *s_01;
  int iVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float wy;
  float ny;
  float fVar16;
  float wx;
  float width;
  float height;
  float fVar17;
  TextureCubeArrayView TVar18;
  int local_240;
  float local_238;
  float local_234;
  Vec3 coordDyo;
  Vec2 lodBounds;
  Vec2 clampedLod;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec4 coord;
  Vec3 coordDxo;
  Vec2 lodBias;
  Vec3 triS [2];
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triQ [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec2 lodO;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  TextureCubeArrayView src;
  undefined1 local_88 [4];
  float fStack_84;
  ConstPixelBufferAccess *pCStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Vec3 local_48;
  float fStack_3c;
  undefined8 local_38;
  
  srcLevelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srcLevelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  srcLevelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = sampleParams->baseLevel;
  iVar8 = sampleParams->maxLevel;
  iVar6 = baseView->m_numLevels + -1;
  iVar3 = iVar6;
  if (iVar5 < iVar6) {
    iVar3 = iVar5;
  }
  iVar7 = 0;
  if (-1 < iVar5) {
    iVar7 = iVar3;
  }
  if (iVar8 < iVar6) {
    iVar6 = iVar8;
  }
  iVar5 = 1;
  if (iVar7 <= iVar8) {
    iVar5 = (iVar6 - iVar7) + 1;
  }
  tcu::TextureCubeArrayView::TextureCubeArrayView
            ((TextureCubeArrayView *)local_88,iVar5,baseView->m_levels + iVar7);
  triS[0].m_data[0] = (float)local_88;
  triS._8_8_ = pCStack_80;
  TVar18 = tcu::getEffectiveTextureView
                     ((TextureCubeArrayView *)triS,&srcLevelStorage,&sampleParams->sampler);
  src.m_levels = TVar18.m_levels;
  src.m_numLevels = TVar18.m_numLevels;
  triS[0].m_data[0] = *texCoord;
  triT[0].m_data[0] = texCoord[1];
  triS[0].m_data[1] = texCoord[4];
  triS[1].m_data[1] = texCoord[8];
  triT[0].m_data[1] = texCoord[5];
  triT[0].m_data[2] = texCoord[9];
  triT[1].m_data[0] = texCoord[0xd];
  triR[0].m_data[0] = texCoord[2];
  triR[0].m_data[1] = texCoord[6];
  triR[0].m_data[2] = texCoord[10];
  triR[1].m_data[0] = texCoord[0xe];
  triQ[0].m_data[0] = texCoord[3];
  triQ[0].m_data[1] = texCoord[7];
  triQ[0].m_data[2] = texCoord[0xb];
  triQ[1].m_data[0] = texCoord[0xf];
  if (src.m_numLevels < 1) {
    iVar5 = 0;
  }
  else {
    iVar5 = ((src.m_levels)->m_size).m_data[0];
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  triS[1].m_data[0] = texCoord[0xc];
  triS[0].m_data[2] = triS[1].m_data[1];
  local_48.m_data[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_48.m_data[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_48.m_data[2] = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_3c = (sampleParams->super_RenderParams).w.m_data[3];
  local_38 = CONCAT44(local_48.m_data[1],local_48.m_data[2]);
  lodBias.m_data[0] = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    lodBias.m_data[0] = (sampleParams->super_RenderParams).bias;
  }
  local_88 = (undefined1  [4])0xbf800000;
  fStack_84 = 0.0;
  pCStack_80 = (ConstPixelBufferAccess *)0x3f800000;
  local_78 = 0xbf80000000000000;
  uStack_70 = 0x3f80000000000000;
  local_68 = 0xbf800000bf800000;
  uStack_60 = 0x3f800000bf800000;
  local_58 = 0xbf8000003f800000;
  uStack_50 = 0x3f8000003f800000;
  refPix.m_data[0] = -1.7146522e+38;
  lodBias.m_data[1] = lodBias.m_data[0];
  triS[1].m_data[2] = triS[0].m_data[1];
  triQ[1].m_data[1] = triQ[0].m_data[2];
  triQ[1].m_data[2] = triQ[0].m_data[1];
  triR[1].m_data[1] = triR[0].m_data[2];
  triR[1].m_data[2] = triR[0].m_data[1];
  triT[1].m_data[1] = triT[0].m_data[2];
  triT[1].m_data[2] = triT[0].m_data[1];
  tcu::RGBA::toVec((RGBA *)&refPix);
  tcu::clear(errorMask,&resPix);
  b = &(sampleParams->super_RenderParams).colorBias;
  b_00 = &(sampleParams->super_RenderParams).colorScale;
  iVar8 = 0;
  local_240 = 0;
  do {
    if ((result->m_size).m_data[1] <= iVar8) {
      std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~_Vector_base(&srcLevelStorage.
                     super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   );
      return local_240;
    }
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    wy = (float)iVar8 + 0.5;
    fVar16 = wy / height;
    iVar3 = 0;
    while( true ) {
      if ((result->m_size).m_data[0] <= iVar3) break;
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&coord,(int)result,iVar3,iVar8);
      tcu::operator-((tcu *)&refPix,(Vector<float,_4> *)&coord,b);
      tcu::operator/((tcu *)&resPix,&refPix,b_00);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&coordDx,(int)reference,iVar3,iVar8);
      tcu::operator-((tcu *)&coord,(Vector<float,_4> *)&coordDx,b);
      tcu::operator/((tcu *)&refPix,(Vector<float,_4> *)&coord,b_00);
      tcu::operator-((tcu *)&coordDx,&resPix,&refPix);
      tcu::abs<float,4>((tcu *)&coord,(Vector<float,_4> *)&coordDx);
      tcu::lessThanEqual<float,4>
                ((tcu *)&coordDy,(Vector<float,_4> *)&coord,&lookupPrec->colorThreshold);
      bVar1 = tcu::boolAll<4>((Vector<bool,_4> *)&coordDy);
      if (!bVar1) {
        wx = (float)iVar3 + 0.5;
        fVar17 = wx / width;
        uVar2 = (ulong)(1.0 < fVar16 + fVar17 + -0.05882353);
        do {
          if ((1.0 <= fVar16 + fVar17 + 0.05882353) < uVar2) {
            coordDx.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&coordDx);
            tcu::PixelBufferAccess::setPixel(errorMask,&coord,iVar3,iVar8,0);
            local_240 = local_240 + 1;
            break;
          }
          fVar15 = fVar17;
          fVar14 = fVar16;
          local_238 = wy;
          local_234 = wx;
          if (uVar2 != 0) {
            fVar15 = 1.0 - fVar17;
            fVar14 = 1.0 - fVar16;
            local_238 = height - wy;
            local_234 = width - wx;
          }
          s = triS + uVar2;
          w = &local_48 + uVar2;
          fVar11 = projectedTriInterpolate(s,w,fVar15,fVar14);
          s_01 = triT + uVar2;
          fVar12 = projectedTriInterpolate(s_01,w,fVar15,fVar14);
          s_00 = triR + uVar2;
          fVar13 = projectedTriInterpolate(s_00,w,fVar15,fVar14);
          coord.m_data[3] = projectedTriInterpolate(triQ + uVar2,w,fVar15,fVar14);
          coord.m_data[0] = fVar11;
          coord.m_data[1] = fVar12;
          coord.m_data[2] = fVar13;
          fVar11 = triDerivateX(s,w,wx,width,fVar14);
          fVar12 = triDerivateX(s_01,w,wx,width,fVar14);
          coordDx.m_data[2] = triDerivateX(s_00,w,wx,width,fVar14);
          coordDx.m_data[0] = fVar11;
          coordDx.m_data[1] = fVar12;
          fVar14 = triDerivateY(s,w,wy,height,fVar15);
          fVar11 = triDerivateY(s_01,w,wy,height,fVar15);
          coordDy.m_data[2] = triDerivateY(s_00,w,wy,height,fVar15);
          coordDy.m_data[0] = fVar14;
          coordDy.m_data[1] = fVar11;
          tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)&clampedLod);
          tcu::computeCubeLodBoundsFromDerivates
                    ((tcu *)&lodBounds,(Vec3 *)&clampedLod,&coordDx,&coordDy,iVar5,lodPrec);
          for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
            fVar15 = *(float *)(local_88 + lVar4 * 8) + local_234;
            fVar13 = *(float *)(local_88 + lVar4 * 8 + 4) + local_238;
            fVar14 = fVar15 / width;
            ny = fVar13 / height;
            fVar11 = projectedTriInterpolate(s,w,fVar14,ny);
            fVar12 = projectedTriInterpolate(s_01,w,fVar14,ny);
            projectedTriInterpolate(s_00,w,fVar14,ny);
            clampedLod.m_data[0] = fVar11;
            clampedLod.m_data[1] = fVar12;
            fVar11 = triDerivateX(s,w,fVar15,width,ny);
            fVar12 = triDerivateX(s_01,w,fVar15,width,ny);
            coordDxo.m_data[2] = triDerivateX(s_00,w,fVar15,width,ny);
            coordDxo.m_data[0] = fVar11;
            coordDxo.m_data[1] = fVar12;
            fVar15 = triDerivateY(s,w,fVar13,height,fVar14);
            fVar11 = triDerivateY(s_01,w,fVar13,height,fVar14);
            coordDyo.m_data[2] = triDerivateY(s_00,w,fVar13,height,fVar14);
            coordDyo.m_data[1] = fVar11;
            coordDyo.m_data[0] = fVar15;
            tcu::computeCubeLodBoundsFromDerivates
                      ((tcu *)&lodO,(Vec3 *)&clampedLod,&coordDxo,&coordDyo,iVar5,lodPrec);
            uVar9 = -(uint)(lodBounds.m_data[0] <= lodO.m_data[0]);
            uVar10 = -(uint)(lodO.m_data[1] <= lodBounds.m_data[1]);
            lodBounds.m_data[0] =
                 (float)(~uVar9 & (uint)lodO.m_data[0] | (uint)lodBounds.m_data[0] & uVar9);
            lodBounds.m_data[1] =
                 (float)(~uVar10 & (uint)lodO.m_data[1] | (uint)lodBounds.m_data[1] & uVar10);
          }
          tcu::operator+(&lodBounds,&lodBias);
          coordDyo.m_data[0] = sampleParams->minLod;
          coordDyo.m_data[1] = sampleParams->maxLod;
          tcu::clampLodBounds((tcu *)&clampedLod,(Vec2 *)&coordDxo,(Vec2 *)&coordDyo,lodPrec);
          bVar1 = tcu::isLookupResultValid
                            (&src,&sampleParams->sampler,lookupPrec,coordBits,&coord,&clampedLod,
                             &resPix);
          uVar2 = uVar2 + 1;
        } while (!bVar1);
      }
      iVar3 = iVar3 + 1;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::IVec4&						coordBits,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeArrayView				src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	const tcu::Vec4								qq					= tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triQ[2]				= { qq.swizzle(0, 1, 2), qq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float((1<<4) + 1); // ES3 requires at least 4 subpixel bits.

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= nx + ny - posEps <= 1.0f;
				const bool		tri1	= nx + ny + posEps >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx		= triNdx ? dstW - wx : wx;
					const float		triWy		= triNdx ? dstH - wy : wy;
					const float		triNx		= triNdx ? 1.0f - nx : nx;
					const float		triNy		= triNdx ? 1.0f - ny : ny;

					const tcu::Vec4	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triQ[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord.toWidth<3>(), coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo			= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo			= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo			= wxo/dstW;
						const float		nyo			= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coordBits, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}